

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster_test_json_parser.h
# Opt level: O1

int Fantasy_Character_json_union_accept_type(uint8_t type)

{
  int iVar1;
  
  iVar1 = 0;
  if ((byte)(type + 1) < 0xd) {
    iVar1 = (&DAT_00135bdc)[(byte)(type + 1)];
  }
  return iVar1;
}

Assistant:

static int Fantasy_Character_json_union_accept_type(uint8_t type)
{
    switch (type) {
    case 0: return 1; /* NONE */
    case 2: return 1; /* MuLan */
    case 8: return 1; /* Rapunzel */
    case 9: return 1; /* Belle */
    case 10: return 1; /* BookFan */
    case 11: return 1; /* Other */
    case 255: return 1; /* Unused */
    default: return 0;
    }
}